

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swap_ranges_suite.cpp
# Opt level: O0

void swap_array(void)

{
  bool bVar1;
  size_type in_RCX;
  basic_variable<std::allocator<char>_> *pbVar2;
  char *pcVar3;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_00;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_01;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_02;
  basic_variable<std::allocator<char>_> *local_908;
  basic_variable<std::allocator<char>_> *local_8f0;
  basic_variable<std::allocator<char>_> *local_8d0;
  basic_variable<std::allocator<char>_> *local_8b8;
  iterator local_8a8;
  iterator local_890;
  iterator local_878;
  iterator local_860;
  nullable local_844;
  basic_variable<std::allocator<char>_> *local_840;
  basic_variable<std::allocator<char>_> local_838;
  basic_variable<std::allocator<char>_> local_808;
  basic_variable<std::allocator<char>_> local_7d8;
  basic_variable<std::allocator<char>_> local_7a8;
  basic_variable<std::allocator<char>_> local_778;
  basic_variable<std::allocator<char>_> local_748;
  basic_variable<std::allocator<char>_> local_718;
  basic_variable<std::allocator<char>_> local_6e8;
  undefined1 local_6b8 [24];
  variable expect_1;
  iterator local_668;
  iterator local_650;
  iterator local_638;
  iterator local_620;
  nullable local_604;
  basic_variable<std::allocator<char>_> *local_600;
  basic_variable<std::allocator<char>_> local_5f8;
  basic_variable<std::allocator<char>_> local_5c8;
  basic_variable<std::allocator<char>_> local_598;
  basic_variable<std::allocator<char>_> local_568;
  basic_variable<std::allocator<char>_> local_538;
  basic_variable<std::allocator<char>_> local_508;
  basic_variable<std::allocator<char>_> local_4d8;
  basic_variable<std::allocator<char>_> local_4a8;
  undefined1 local_478 [24];
  variable expect;
  iterator local_430;
  iterator local_418;
  iterator local_400;
  iterator local_3e8;
  undefined1 local_3d0 [8];
  iterator where;
  basic_variable<std::allocator<char>_> local_3a8;
  basic_variable<std::allocator<char>_> local_378;
  basic_variable<std::allocator<char>_> local_348;
  basic_variable<std::allocator<char>_> local_318;
  basic_variable<std::allocator<char>_> local_2e8;
  basic_variable<std::allocator<char>_> local_2b8;
  basic_variable<std::allocator<char>_> local_288;
  basic_variable<std::allocator<char>_> local_258;
  undefined1 local_228 [16];
  undefined1 local_218 [8];
  variable other;
  nullable local_1d4;
  basic_variable<std::allocator<char>_> *local_1d0;
  basic_variable<std::allocator<char>_> local_1c8;
  basic_variable<std::allocator<char>_> local_198;
  basic_variable<std::allocator<char>_> local_168;
  basic_variable<std::allocator<char>_> local_138;
  basic_variable<std::allocator<char>_> local_108;
  basic_variable<std::allocator<char>_> local_d8;
  basic_variable<std::allocator<char>_> local_a8;
  basic_variable<std::allocator<char>_> local_78;
  undefined1 local_48 [16];
  undefined1 local_38 [8];
  variable data;
  
  local_1d0 = &local_1c8;
  local_1d4 = null;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_1d0,&local_1d4);
  local_1d0 = &local_198;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(local_1d0,true);
  local_1d0 = &local_168;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_1d0,2);
  local_1d0 = &local_138;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(local_1d0,3.0);
  local_1d0 = &local_108;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_1d0,"alpha");
  local_1d0 = &local_d8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_1d0,L"bravo");
  local_1d0 = &local_a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_1d0,L"charlie");
  local_1d0 = &local_78;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_1d0,L"delta");
  local_48._0_8_ = &local_1c8;
  local_48._8_8_ = 8;
  init._M_len = in_RCX;
  init._M_array = (iterator)0x8;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)local_38,
             (basic_array<std::allocator<char>_> *)local_48._0_8_,init);
  pbVar2 = &local_1c8;
  local_8b8 = (basic_variable<std::allocator<char>_> *)local_48;
  do {
    local_8b8 = local_8b8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_8b8);
  } while (local_8b8 != pbVar2);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_3a8,L"delta");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_378,L"charlie");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_348,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_318,"alpha");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(&local_2e8,3.0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_2b8,2);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_288,true);
  where.
  super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  .current._12_4_ = 0;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable
            (&local_258,
             (nullable *)
             &where.
              super_iterator_base<trial::dynamic::basic_variable<std::allocator<char>_>::iterator,_trial::dynamic::basic_variable<std::allocator<char>_>_>
              .current.field_0xc);
  local_228._0_8_ = &local_3a8;
  local_228._8_8_ = 8;
  init_00._M_len = (size_type)pbVar2;
  init_00._M_array = (iterator)0x8;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)local_218,
             (basic_array<std::allocator<char>_> *)local_228._0_8_,init_00);
  local_8d0 = (basic_variable<std::allocator<char>_> *)local_228;
  do {
    local_8d0 = local_8d0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_8d0);
  } while (local_8d0 != &local_3a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_3e8,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_400,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_418,(basic_variable<std::allocator<char>_> *)local_218);
  std::
  swap_ranges<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator>
            ((iterator *)local_3d0,&local_3e8,&local_400,&local_418);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_418);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_400);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_3e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_430,(basic_variable<std::allocator<char>_> *)local_218);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>_>::iterator::operator==
                    ((iterator *)local_3d0,&local_430);
  boost::detail::test_impl
            ("where == other.end()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/swap_ranges_suite.cpp"
             ,0x286,"void swap_array()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_430);
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>>::
          is<trial::dynamic::basic_array<std::allocator<char>>>
                    ((basic_variable<std::allocator<char>> *)local_38);
  pcVar3 = "void swap_array()";
  boost::detail::test_impl
            ("data.is<array>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/swap_ranges_suite.cpp"
             ,0x288,"void swap_array()",bVar1);
  local_600 = &local_5f8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_600,L"delta");
  local_600 = &local_5c8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_600,L"charlie");
  local_600 = &local_598;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_600,L"bravo");
  local_600 = &local_568;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_600,"alpha");
  local_600 = &local_538;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(local_600,3.0);
  local_600 = &local_508;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_600,2);
  local_600 = &local_4d8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(local_600,true);
  local_600 = &local_4a8;
  local_604 = null;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_600,&local_604);
  local_478._0_8_ = &local_5f8;
  local_478._8_8_ = 8;
  init_01._M_len = (size_type)pcVar3;
  init_01._M_array = (iterator)0x8;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_478 + 0x10),
             (basic_array<std::allocator<char>_> *)local_478._0_8_,init_01);
  local_8f0 = (basic_variable<std::allocator<char>_> *)local_478;
  do {
    local_8f0 = local_8f0 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_8f0);
  } while (local_8f0 != &local_5f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_620,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_638,(basic_variable<std::allocator<char>_> *)local_38);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_650,(basic_variable<std::allocator<char>_> *)(local_478 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_668,(basic_variable<std::allocator<char>_> *)(local_478 + 0x10));
  boost::detail::
  test_all_with_impl<std::ostream,trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/swap_ranges_suite.cpp"
             ,0x28c,"void swap_array()",&local_620,&local_638,&local_650,&local_668);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_668);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_650);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_638);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_620);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_478 + 0x10));
  bVar1 = trial::dynamic::basic_variable<std::allocator<char>>::
          is<trial::dynamic::basic_array<std::allocator<char>>>
                    ((basic_variable<std::allocator<char>> *)local_218);
  pcVar3 = "void swap_array()";
  boost::detail::test_impl
            ("other.is<array>()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/swap_ranges_suite.cpp"
             ,0x28f,"void swap_array()",bVar1);
  local_840 = &local_838;
  local_844 = null;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_840,&local_844);
  local_840 = &local_808;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(local_840,true);
  local_840 = &local_7d8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_840,2);
  local_840 = &local_7a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(local_840,3.0);
  local_840 = &local_778;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_840,"alpha");
  local_840 = &local_748;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_840,L"bravo");
  local_840 = &local_718;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_840,L"charlie");
  local_840 = &local_6e8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_840,L"delta");
  local_6b8._0_8_ = &local_838;
  local_6b8._8_8_ = 8;
  init_02._M_len = (size_type)pcVar3;
  init_02._M_array = (iterator)0x8;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_6b8 + 0x10),
             (basic_array<std::allocator<char>_> *)local_6b8._0_8_,init_02);
  local_908 = (basic_variable<std::allocator<char>_> *)local_6b8;
  do {
    local_908 = local_908 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_908);
  } while (local_908 != &local_838);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_860,(basic_variable<std::allocator<char>_> *)local_218);
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_878,(basic_variable<std::allocator<char>_> *)local_218);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_890,(basic_variable<std::allocator<char>_> *)(local_6b8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_8a8,(basic_variable<std::allocator<char>_> *)(local_6b8 + 0x10));
  boost::detail::
  test_all_with_impl<std::ostream,trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::basic_variable<std::allocator<char>>::iterator,std::equal_to<trial::dynamic::basic_variable<std::allocator<char>>>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/swap_ranges_suite.cpp"
             ,0x293,"void swap_array()",&local_860,&local_878,&local_890,&local_8a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_8a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_890);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_878);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_860);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_6b8 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator((iterator *)local_3d0);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_218);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  return;
}

Assistant:

void swap_array()
{
    variable data = array::make({ null, true, 2, 3.0, "alpha", L"bravo", u"charlie", U"delta" });
    variable other = array::make({ U"delta", u"charlie", L"bravo", "alpha", 3.0, 2, true, null });
    auto where = std::swap_ranges(data.begin(), data.end(), other.begin());
    TRIAL_PROTOCOL_TEST(where == other.end());
    {
        TRIAL_PROTOCOL_TEST(data.is<array>());
        variable expect = array::make({ U"delta", u"charlie", L"bravo", "alpha", 3.0, 2, true, null });
        TRIAL_PROTOCOL_TEST_ALL_WITH(data.begin(), data.end(),
                                     expect.begin(), expect.end(),
                                     std::equal_to<variable>());
    }
    {
        TRIAL_PROTOCOL_TEST(other.is<array>());
        variable expect = array::make({ null, true, 2, 3.0, "alpha", L"bravo", u"charlie", U"delta" });
        TRIAL_PROTOCOL_TEST_ALL_WITH(other.begin(), other.end(),
                                     expect.begin(), expect.end(),
                                     std::equal_to<variable>());
    }
}